

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O2

bool __thiscall
lan::db::append<bool>(db *this,db_bit *context,string *name,bool value,db_bit_type type)

{
  bool bVar1;
  db_bits *in_RAX;
  db_bit *pdVar2;
  db_bit *var;
  string *name_00;
  string local_70;
  string local_50;
  
  this->data = context;
  if ((context->type == Container) &&
     (pdVar2 = context->lin, this->data = pdVar2, pdVar2 != (db_bit *)0x0)) {
    pdVar2 = get_last_bit(this,in_RAX);
    this->data = pdVar2;
    var = (db_bit *)operator_new(0x50);
    (var->key)._M_dataplus._M_p = (pointer)&(var->key).field_2;
    (var->key)._M_string_length = 0;
    (var->key).field_2._M_local_buf[0] = '\0';
    var->data = (void *)0x0;
    var->pre = (db_bit *)0x0;
    var->nex = (db_bit *)0x0;
    var->lin = (db_bit *)0x0;
    var->con = (db_bit *)0x0;
    pdVar2->nex = var;
    var->pre = pdVar2;
    this->data = var;
    if ((int)type < 9) {
      name_00 = &local_50;
      std::__cxx11::string::string((string *)name_00,(string *)name);
      bVar1 = set_bit<bool>(this,context,var,name_00,type,value);
    }
    else {
      name_00 = &local_70;
      std::__cxx11::string::string((string *)name_00,(string *)name);
      bVar1 = set_bit(this,context,var,name_00,type);
    }
    std::__cxx11::string::~string((string *)name_00);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool append(lan::db_bit * context, std::string const name, any const value, db_bit_type const type){
            data = context;
            if(data-> type == lan::Container and (data = data->lin)){
                data = get_last_bit(data);
                data->nex = new db_bit; data->nex->pre = data; data = data->nex;
                return ((type < lan::Array) ? set_bit(context, data, name, type, value) : set_bit(context, data, name, type));
            } return false;
        }